

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O3

int secp256r1sha256_sign(void *data,ptls_buffer_t *outbuf,ptls_iovec_t input)

{
  size_t sVar1;
  int iVar2;
  uECC_Curve curve;
  size_t body_size;
  uint8_t hash [32];
  uint8_t sig [64];
  undefined1 local_ca;
  undefined1 local_c9;
  uint8_t local_c8 [32];
  cf_sha256_context local_a8;
  
  cf_sha256_init(&local_a8);
  cf_sha256_update(&local_a8,input.base,input.len);
  cf_sha256_digest_final(&local_a8,local_c8);
  (*ptls_clear_memory)(&local_a8,0x70);
  curve = uECC_secp256r1();
  uECC_sign((uint8_t *)data,local_c8,0x20,(uint8_t *)&local_a8,curve);
  local_c9 = 0x30;
  iVar2 = ptls_buffer__do_pushv(outbuf,&local_c9,1);
  if (iVar2 == 0) {
    local_ca = 0xff;
    iVar2 = ptls_buffer__do_pushv(outbuf,&local_ca,1);
    if (iVar2 == 0) {
      sVar1 = outbuf->off;
      iVar2 = ptls_buffer_push_asn1_ubigint(outbuf,&local_a8,0x20);
      if ((iVar2 == 0) &&
         (iVar2 = ptls_buffer_push_asn1_ubigint(outbuf,local_a8.partial,0x20), iVar2 == 0)) {
        body_size = outbuf->off - sVar1;
        if (body_size < 0x80) {
          outbuf->base[sVar1 - 1] = (uint8_t)body_size;
          iVar2 = 0;
        }
        else {
          iVar2 = ptls_buffer__adjust_asn1_blocksize(outbuf,body_size);
        }
      }
    }
  }
  (*ptls_clear_memory)(local_c8,0x20);
  (*ptls_clear_memory)(&local_a8,0x40);
  return iVar2;
}

Assistant:

static int secp256r1sha256_sign(void *data, ptls_buffer_t *outbuf, ptls_iovec_t input)
{
    uint8_t hash[32], sig[64];
    int ret;

    { /* calc hash */
        cf_sha256_context ctx;
        cf_sha256_init(&ctx);
        cf_sha256_update(&ctx, input.base, input.len);
        cf_sha256_digest_final(&ctx, hash);
        ptls_clear_memory(&ctx, sizeof(ctx));
    }

    /* sign */
    uECC_sign(data, hash, sizeof(hash), sig, uECC_secp256r1());

    /* encode using DER */
    ptls_buffer_push_asn1_sequence(outbuf, {
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig, 32)) != 0)
            goto Exit;
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig + 32, 32)) != 0)
            goto Exit;
    });

    ret = 0;

Exit:
    ptls_clear_memory(hash, sizeof(hash));
    ptls_clear_memory(sig, sizeof(sig));
    return ret;
}